

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

void EncodeSetOrSequenceOf<AlgorithmIdentifier>
               (DerType type,vector<AlgorithmIdentifier,_std::allocator<AlgorithmIdentifier>_> *in,
               uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  out_of_range *this;
  code *pcVar4;
  undefined *puVar5;
  size_t local_38;
  size_t cbInternal;
  
  local_38 = 0;
  if (*(long *)(in + 8) == *(long *)in) {
    if (cbOut < 2) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error
                ((overflow_error *)this,"Overflow in EncodeSetOrSequenceOf");
      puVar5 = &std::overflow_error::typeinfo;
      pcVar4 = std::overflow_error::~overflow_error;
      goto LAB_0011ec4a;
    }
    pOut[0] = '\x05';
    pOut[1] = '\0';
    sVar3 = 2;
  }
  else {
    *pOut = (uchar)type;
    sVar3 = GetEncodedSize<AlgorithmIdentifier>(in);
    bVar1 = EncodeSize(sVar3,pOut + 1,cbOut - 1,&local_38);
    if (!bVar1) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"Error in EncodeSize");
      puVar5 = &std::out_of_range::typeinfo;
      pcVar4 = std::out_of_range::~out_of_range;
LAB_0011ec4a:
      __cxa_throw(this,puVar5,pcVar4);
    }
    sVar3 = local_38 + 1;
    uVar2 = 0;
    while( true ) {
      if ((ulong)((*(long *)(in + 8) - *(long *)in) / 0x68) <= (ulong)uVar2) break;
      AlgorithmIdentifier::Encode
                ((AlgorithmIdentifier *)(*(long *)in + (ulong)uVar2 * 0x68),pOut + sVar3,
                 cbOut - sVar3,&local_38);
      sVar3 = sVar3 + local_38;
      uVar2 = uVar2 + 1;
    }
  }
  *cbUsed = sVar3;
  return;
}

Assistant:

void EncodeSetOrSequenceOf(DerType type, std::vector<T>& in, unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
	size_t cbInternal = 0;
	size_t offset = 0;

	if (in.size() == 0)
	{
		if (cbOut < 2)
			throw std::overflow_error("Overflow in EncodeSetOrSequenceOf");

		pOut[0] = static_cast<unsigned char>(DerType::Null);
		pOut[1] = 0;
		cbUsed = 2;
		return;
	}

	pOut[0] = static_cast<unsigned char>(type);

	size_t cbVector = GetEncodedSize(in);

	offset = 1;
	if (!EncodeSize(cbVector, pOut + offset, cbOut - offset, cbInternal))
		throw std::out_of_range("Error in EncodeSize");

	offset += cbInternal;

	for (unsigned int i = 0; i < in.size(); ++i)
	{
		in[i].Encode(pOut + offset, cbOut - offset, cbInternal);
		offset += cbInternal;
	}

	cbUsed = offset;
}